

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5NodeCompare(Fts5Expr *pExpr,Fts5ExprNode *p1,Fts5ExprNode *p2)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  
  iVar4 = -1;
  if ((p2->bEof == 0) && (iVar4 = 1, p1->bEof == 0)) {
    lVar1 = p1->iRowid;
    lVar2 = p2->iRowid;
    if (pExpr->bDesc == 0) {
      iVar4 = -1;
      if (lVar2 <= lVar1) {
        bVar3 = lVar2 < lVar1;
        goto LAB_001cef8a;
      }
    }
    else {
      iVar4 = -1;
      if (lVar1 <= lVar2) {
        bVar3 = lVar1 < lVar2;
LAB_001cef8a:
        return (int)bVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

static int fts5NodeCompare(
  Fts5Expr *pExpr,
  Fts5ExprNode *p1, 
  Fts5ExprNode *p2
){
  if( p2->bEof ) return -1;
  if( p1->bEof ) return +1;
  return fts5RowidCmp(pExpr, p1->iRowid, p2->iRowid);
}